

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckId(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  Lexer *pLVar2;
  Bool BVar3;
  Node *pNVar4;
  uint uVar5;
  ctmbstr s;
  char *pcVar6;
  
  if ((attval == (AttVal *)0x0) || (pcVar6 = attval->value, pcVar6 == (char *)0x0)) {
    uVar5 = 0x256;
    goto LAB_00137013;
  }
  pLVar2 = doc->lexer;
  do {
    cVar1 = *pcVar6;
    if (cVar1 == '\0') goto LAB_00136fcc;
    pcVar6 = pcVar6 + 1;
    BVar3 = prvTidyIsHTMLSpace((int)cVar1);
  } while (BVar3 == no);
  if (cVar1 != '\0') {
    if (pLVar2->isvoyager == no) {
LAB_00136fb9:
      uVar5 = 0x22b;
    }
    else {
      BVar3 = prvTidyIsValidXMLID(attval->value);
      uVar5 = 0x292;
      if (BVar3 == no) goto LAB_00136fb9;
    }
    prvTidyReportAttrError(doc,node,attval,uVar5);
  }
LAB_00136fcc:
  pNVar4 = GetNodeByAnchor(doc,attval->value);
  if (pNVar4 == node || pNVar4 == (Node *)0x0) {
    AddAnchor(doc,attval->value,node);
    return;
  }
  if (node->implicit == no) {
    uVar5 = 0x223;
  }
  else {
    uVar5 = 0x224;
  }
LAB_00137013:
  prvTidyReportAttrError(doc,node,attval,uVar5);
  return;
}

Assistant:

void CheckId( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    Lexer* lexer = doc->lexer;
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if (!TY_(IsValidHTMLID)(attval->value))
    {
        if (lexer->isvoyager && TY_(IsValidXMLID)(attval->value))
            TY_(ReportAttrError)( doc, node, attval, XML_ID_SYNTAX);
        else
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }

    if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
    {
        if (node->implicit) /* Is #709 - improve warning text */
            TY_(ReportAttrError)(doc, node, attval, ANCHOR_DUPLICATED);
        else
            TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
    }
    else
        AddAnchor( doc, attval->value, node );
}